

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::EndLocalDecls(BinaryReaderInterp *this)

{
  FuncDesc *pFVar1;
  bool bVar2;
  size_type sVar3;
  value_type local_60;
  ValueType local_24;
  uint local_1c;
  BinaryReaderInterp *pBStack_18;
  Index i;
  BinaryReaderInterp *this_local;
  
  pBStack_18 = this;
  if (this->local_count_ != 0) {
    Istream::Emit(this->istream_,InterpAlloca,this->local_count_);
    for (local_1c = 0; local_1c < this->local_count_; local_1c = local_1c + 1) {
      pFVar1 = this->func_;
      sVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                        (&(this->func_->type).params);
      local_24 = FuncDesc::GetLocalType(pFVar1,(int)sVar3 + local_1c);
      bVar2 = Type::IsRef(&local_24);
      if (bVar2) {
        Istream::Emit(this->istream_,InterpMarkRef,this->local_count_ - local_1c);
      }
    }
  }
  pFVar1 = this->func_;
  local_60.kind = Catch;
  local_60.try_start_offset = Istream::end(this->istream_);
  local_60.try_end_offset = 0xffffffff;
  memset(&local_60.catches,0,0x18);
  std::vector<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>::vector
            (&local_60.catches);
  local_60.field_4.catch_all_offset = 0xffffffff;
  local_60.values = this->local_count_;
  local_60.exceptions = 0;
  local_60.catch_all_ref = false;
  std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::push_back
            (&pFVar1->handlers,&local_60);
  HandlerDesc::~HandlerDesc(&local_60);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::EndLocalDecls() {
  if (local_count_ != 0) {
    istream_.Emit(Opcode::InterpAlloca, local_count_);
    for (Index i = 0; i < local_count_; i++) {
      if (func_->GetLocalType(func_->type.params.size() + i).IsRef()) {
        istream_.Emit(Opcode::InterpMarkRef, local_count_ - i);
      }
    }
  }
  // Continuation of the implicit func label, used for exception handling. (See
  // BeginFunctionBody.)
  // We need the local count for this, which is only available after processing
  // all local decls.
  // NOTE: we don't count the parameters, as they're not part of the frame.
  func_->handlers.push_back(HandlerDesc{HandlerKind::Catch,
                                        istream_.end(),
                                        Istream::kInvalidOffset,
                                        {},
                                        {Istream::kInvalidOffset},
                                        static_cast<u32>(local_count_),
                                        0});

  return Result::Ok;
}